

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableRemove(ImGuiTable *table)

{
  ImPool<ImGuiTable> *this;
  ImGuiID key;
  ImGuiContext *pIVar1;
  uint uVar2;
  ImPoolIdx idx;
  
  pIVar1 = GImGui;
  this = &GImGui->Tables;
  uVar2 = ImPool<ImGuiTable>::GetIndex(this,table);
  key = table->ID;
  idx = ImPool<ImGuiTable>::GetIndex(this,table);
  ImPool<ImGuiTable>::Remove(this,key,idx);
  if ((-1 < (int)uVar2) && ((int)uVar2 < (pIVar1->TablesLastTimeActive).Size)) {
    (pIVar1->TablesLastTimeActive).Data[uVar2] = -1.0;
    return;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x74f,"T &ImVector<float>::operator[](int) [T = float]");
}

Assistant:

void ImGui::TableRemove(ImGuiTable* table)
{
    //IMGUI_DEBUG_LOG("TableRemove() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    int table_idx = g.Tables.GetIndex(table);
    //memset(table->RawData.Data, 0, table->RawData.size_in_bytes());
    //memset(table, 0, sizeof(ImGuiTable));
    g.Tables.Remove(table->ID, table);
    g.TablesLastTimeActive[table_idx] = -1.0f;
}